

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CheckProximity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  int iVar3;
  int flags;
  int iVar4;
  char *pcVar5;
  PClass *ti;
  AActor *self;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003f05d0;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f05b7:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f05d0:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1971,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003f048a;
    bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f05d0;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003f05b7;
LAB_003f048a:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003f05ef;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003f05c0:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f05ef:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1972,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  ti = (PClass *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (ti == (PClass *)0x0) goto LAB_003f04dc;
    bVar2 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,ti);
    if (!bVar2) {
      pcVar5 = "classname == NULL || classname->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f05ef;
    }
  }
  else {
    if (ti != (PClass *)0x0) goto LAB_003f05c0;
LAB_003f04dc:
    ti = (PClass *)0x0;
  }
  if ((uint)numparam < 3) {
    pcVar5 = "(paramnum) < numparam";
LAB_003f0617:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1973,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    pcVar5 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003f0617;
  }
  pVVar1 = param + 2;
  if (numparam == 3) {
    param = defaultparam->Array;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f0686:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1974,
                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar3 = param[3].field_0.i;
LAB_003f0545:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f06a5:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1975,
                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    flags = param[4].field_0.i;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003f0686;
    }
    iVar3 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003f0545;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003f06a5;
    }
    flags = param[4].field_0.i;
    if (numparam != 5) {
      if (param[5].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003f0636;
      }
      goto LAB_003f055f;
    }
    param = defaultparam->Array;
  }
  if (param[5].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003f0636:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1976,
                  "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003f055f:
  iVar4 = 0;
  iVar3 = P_Thing_CheckProximity(self,ti,(pVVar1->field_0).f,iVar3,flags,param[5].field_0.i,false);
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1978,
                    "int AF_AActor_CheckProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    VMReturn::SetInt(ret,(uint)(iVar3 != 0));
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckProximity)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(classname, AActor);
	PARAM_FLOAT(distance);
	PARAM_INT_DEF(count);
	PARAM_INT_DEF(flags);
	PARAM_INT_DEF(ptr);

	ACTION_RETURN_BOOL(!!P_Thing_CheckProximity(self, classname, distance, count, flags, ptr));
}